

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O2

void ssh1_bpp_free(BinaryPacketProtocol *bpp)

{
  toplevel_callback_fn_t p_Var1;
  long *plVar2;
  crcda_ctx *ctx;
  
  p_Var1 = bpp[-1].ic_in_raw.fn;
  if (p_Var1 != (toplevel_callback_fn_t)0x0) {
    (**(code **)(*(long *)p_Var1 + 8))();
  }
  plVar2 = (long *)bpp[-1].ic_in_raw.ctx;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  plVar2 = *(long **)&bpp[-1].ic_out_pq.queued;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))();
  }
  if (*(long **)&bpp[-1].remote_bugs != (long *)0x0) {
    (**(code **)(**(long **)&bpp[-1].remote_bugs + 0x30))();
  }
  ctx = *(crcda_ctx **)&bpp[-1].ic_in_raw.queued;
  if (ctx != (crcda_ctx *)0x0) {
    crcda_free_context(ctx);
  }
  safefree(bpp[-1].ssh);
  safefree(&bpp[-1].out_pq);
  return;
}

Assistant:

static void ssh1_bpp_free(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);
    if (s->cipher_in)
        ssh_cipher_free(s->cipher_in);
    if (s->cipher_out)
        ssh_cipher_free(s->cipher_out);
    if (s->compctx)
        ssh_compressor_free(s->compctx);
    if (s->decompctx)
        ssh_decompressor_free(s->decompctx);
    if (s->crcda_ctx)
        crcda_free_context(s->crcda_ctx);
    sfree(s->pktin);
    sfree(s);
}